

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  curl_trc_feat *pcVar1;
  curl_slist *pcVar2;
  bool bVar3;
  uchar uVar4;
  byte httpversion;
  _Bool _Var5;
  byte bVar6;
  CURLcode CVar7;
  int iVar8;
  CURLUcode CVar9;
  int iVar10;
  CURLcode CVar11;
  char *pcVar12;
  char *pcVar13;
  curl_mimepart *pcVar14;
  CURLU *u;
  char *pcVar15;
  Curl_llist_node *pCVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  curl_off_t cVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  char *pcVar24;
  char *pcVar25;
  uint uVar26;
  char *pcVar27;
  curl_slist **ppcVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  size_t blen;
  bool bVar34;
  dynbuf req;
  long local_98;
  char *local_90;
  Curl_HttpReq httpreq;
  char *local_80;
  char *local_78;
  char *local_70;
  Curl_llist local_68;
  char *local_48;
  char *local_40;
  char *request;
  
  conn = data->conn;
  *done = true;
  if (((conn->alpn == '\x03') && (uVar4 = Curl_conn_http_version(data,conn), uVar4 != '\x14')) &&
     (((ulong)conn->bits & 0x18) == 0x10)) {
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  CVar7 = Curl_headers_init(data);
  if (CVar7 != CURLE_OK) goto LAB_00131a90;
  if (((data->state).field_0x7be & 8) == 0) {
    (*Curl_cfree)((data->state).first_host);
    pcVar12 = (*Curl_cstrdup)((conn->host).name);
    (data->state).first_host = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).first_remote_port = conn->remote_port;
    (data->state).first_remote_protocol = conn->handler->protocol;
  }
  (*Curl_cfree)((data->state).aptr.host);
  (data->state).aptr.host = (char *)0x0;
  pcVar12 = Curl_checkheaders(data,"Host",4);
  if ((pcVar12 == (char *)0x0) ||
     ((((data->state).field_0x7be & 8) != 0 &&
      (iVar8 = curl_strequal((data->state).first_host,(conn->host).name), iVar8 == 0)))) {
    pcVar12 = (conn->host).name;
    uVar26 = conn->given->protocol;
    if (((uVar26 & 0x80000002) == 0 || conn->remote_port != 0x1bb) &&
       (conn->remote_port != 0x50 || (uVar26 & 0x40000001) == 0)) {
      bVar34 = (*(uint *)&conn->bits >> 10 & 1) == 0;
      pcVar13 = "[";
      if (bVar34) {
        pcVar13 = "";
      }
      pcVar25 = "]";
      if (bVar34) {
        pcVar25 = "";
      }
      pcVar12 = curl_maprintf("Host: %s%s%s:%d\r\n",pcVar13,pcVar12,pcVar25);
    }
    else {
      bVar34 = (*(uint *)&conn->bits >> 10 & 1) == 0;
      pcVar13 = "[";
      if (bVar34) {
        pcVar13 = "";
      }
      pcVar25 = "]";
      if (bVar34) {
        pcVar25 = "";
      }
      pcVar12 = curl_maprintf("Host: %s%s%s\r\n",pcVar13,pcVar12,pcVar25);
    }
LAB_00131c58:
    (data->state).aptr.host = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar13 = Curl_copy_header_value(pcVar12);
    if (pcVar13 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar13 == '[') {
      sVar18 = strlen(pcVar13);
      memmove(pcVar13,pcVar13 + 1,sVar18 - 1);
      iVar8 = 0x5d;
LAB_00131c92:
      pcVar25 = strchr(pcVar13,iVar8);
      if (pcVar25 != (char *)0x0) {
        *pcVar25 = '\0';
      }
      (*Curl_cfree)((data->state).aptr.cookiehost);
      (data->state).aptr.cookiehost = pcVar13;
    }
    else {
      if (*pcVar13 != '\0') {
        iVar8 = 0x3a;
        goto LAB_00131c92;
      }
      (*Curl_cfree)(pcVar13);
    }
    iVar8 = curl_strequal("Host:",pcVar12);
    if (iVar8 == 0) {
      pcVar12 = curl_maprintf("Host:%s\r\n",pcVar12 + 5);
      goto LAB_00131c58;
    }
  }
  pcVar12 = Curl_checkheaders(data,"User-Agent",10);
  if (pcVar12 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  Curl_http_method(data,conn,&request,&httpreq);
  pcVar12 = (data->state).up.path;
  if ((data->state).up.query == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pcVar12 = curl_maprintf("%s?%s",pcVar12);
    pcVar13 = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar7 = Curl_http_output_auth(data,conn,request,httpreq,pcVar12,false);
  (*Curl_cfree)(pcVar13);
  if (CVar7 != CURLE_OK) goto LAB_00131a90;
  (*Curl_cfree)((data->state).aptr.ref);
  (data->state).aptr.ref = (char *)0x0;
  if (((data->state).referer != (char *)0x0) &&
     (pcVar12 = Curl_checkheaders(data,"Referer",7), pcVar12 == (char *)0x0)) {
    pcVar12 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
    (data->state).aptr.ref = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar12 = Curl_checkheaders(data,"Accept-Encoding",0xf);
  if ((pcVar12 == (char *)0x0) && ((data->set).str[0x21] != (char *)0x0)) {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    pcVar12 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
    (data->state).aptr.accept_encoding = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    (data->state).aptr.accept_encoding = (char *)0x0;
  }
  pcVar12 = Curl_checkheaders(data,"TE",2);
  if ((pcVar12 == (char *)0x0) && (((data->set).field_0x897 & 1) != 0)) {
    pcVar12 = Curl_checkheaders(data,"Connection",10);
    (*Curl_cfree)((data->state).aptr.te);
    (data->state).aptr.te = (char *)0x0;
    if (pcVar12 == (char *)0x0) {
      pcVar13 = "";
      pcVar25 = "";
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar13 = Curl_copy_header_value(pcVar12);
      if (pcVar13 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar25 = ", ";
      pcVar12 = pcVar13;
      if (*pcVar13 == '\0') {
        pcVar25 = "";
      }
    }
    pcVar13 = curl_maprintf("Connection: %s%sTE\r\nTE: gzip\r\n",pcVar13,pcVar25);
    (data->state).aptr.te = pcVar13;
    (*Curl_cfree)(pcVar12);
    if ((data->state).aptr.te == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  httpversion = Curl_conn_http_version(data,data->conn);
  uVar26 = (uint)httpversion;
  if (httpversion == 0x1e) {
    pcVar12 = "3";
  }
  else if (httpversion == 0xb) {
LAB_00131fbe:
    uVar26 = 0xb;
    pcVar12 = "1.1";
  }
  else if (httpversion == 0x14) {
    pcVar12 = "2";
    uVar26 = 0x14;
  }
  else {
    pcVar12 = "1.0";
    uVar26 = (uint)httpversion;
    if (httpversion == 0) {
      httpversion = 10;
      uVar26 = 10;
      if (((data->state).http_neg.rcvd_min != '\n') &&
         (((data->conn == (connectdata *)0x0 || (data->conn->httpversion_seen != '\n')) &&
          (((data->state).http_neg.field_0x3 & 8) == 0)))) {
        httpversion = 0xb;
        goto LAB_00131fbe;
      }
    }
  }
  if (((data->req).field_0xdb & 4) != 0) {
LAB_001320e3:
    CVar7 = Curl_creader_set_null(data);
    goto LAB_00132102;
  }
  if (3 < httpreq - HTTPREQ_POST) {
    (data->state).infilesize = 0;
    goto LAB_001320e3;
  }
  blen = (data->state).infilesize;
  switch(httpreq) {
  case HTTPREQ_POST:
    if (blen != 0) {
      pcVar13 = (char *)(data->set).postfields;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
        if (pcVar13 != (char *)0x0) {
          _Var5 = Curl_compareheader(pcVar13,"Transfer-Encoding:",0x12,"chunked",7);
          if (_Var5) {
            blen = 0xffffffffffffffff;
          }
        }
        goto LAB_00132066;
      }
      if (0 < (long)blen) {
        CVar7 = Curl_creader_set_buf(data,pcVar13,blen);
        break;
      }
    }
LAB_001320f0:
    CVar7 = Curl_creader_set_null(data);
    break;
  case HTTPREQ_POST_FORM:
    if ((data->state).formp == (curl_mimepart *)0x0) {
      pcVar14 = (curl_mimepart *)(*Curl_ccalloc)(1,0x1b8);
      (data->state).formp = pcVar14;
      if (pcVar14 == (curl_mimepart *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      Curl_mime_cleanpart(pcVar14);
      CVar7 = Curl_getformdata(data,(data->state).formp,(data->set).httppost,
                               (data->state).fread_func);
      if (CVar7 != CURLE_OK) {
        (*Curl_cfree)((data->state).formp);
        (data->state).formp = (curl_mimepart *)0x0;
        goto LAB_00131a90;
      }
      pcVar14 = (data->state).formp;
      (data->state).mimepost = pcVar14;
    }
    else {
      pcVar14 = (data->state).mimepost;
    }
    if (pcVar14 != (curl_mimepart *)0x0) goto LAB_0013209b;
    CVar11 = Curl_creader_set_null(data);
    goto LAB_00132483;
  case HTTPREQ_POST_MIME:
    (data->state).mimepost = &(data->set).mimepost;
LAB_0013209b:
    pcVar13 = Curl_checkheaders(data,"Content-Type",0xc);
    pcVar14 = (data->state).mimepost;
    pcVar14->flags = pcVar14->flags | 2;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = (char *)0x0;
      if (pcVar14->kind == MIMEKIND_MULTIPART) {
        pcVar13 = "multipart/form-data";
      }
    }
    else {
      pcVar25 = pcVar13 + 0xc;
      do {
        pcVar13 = pcVar25 + 1;
        pcVar24 = pcVar25 + 1;
        pcVar25 = pcVar13;
      } while (*pcVar24 == ' ');
    }
    curl_mime_headers(pcVar14,(data->set).headers,0);
    CVar7 = Curl_mime_prepare_headers
                      (data,(data->state).mimepost,pcVar13,(char *)0x0,MIMESTRATEGY_FORM);
    if (CVar7 != CURLE_OK) goto LAB_00131a90;
    curl_mime_headers((data->state).mimepost,(curl_slist *)0x0,0);
    CVar7 = Curl_creader_set_mime(data,(data->state).mimepost);
    CVar11 = CURLE_OK;
    if (CVar7 != CURLE_OK) goto LAB_00131a90;
LAB_00132483:
    CVar7 = CVar11;
    cVar20 = Curl_creader_total_length(data);
    (data->state).infilesize = cVar20;
    break;
  case HTTPREQ_PUT:
    if (blen == 0) goto LAB_001320f0;
LAB_00132066:
    CVar7 = Curl_creader_set_fread(data,blen);
  }
LAB_00132102:
  if (CVar7 != CURLE_OK) goto LAB_00131a90;
  if ((httpreq == HTTPREQ_PUT) || (httpreq == HTTPREQ_POST)) {
    lVar23 = (data->state).resume_from;
    if (lVar23 != 0) {
      if (lVar23 < 0) {
        (data->state).resume_from = 0;
      }
      else if ((((data->req).field_0xdb & 4) == 0) &&
              (CVar7 = Curl_creader_resume_from(data,lVar23), CVar7 != CURLE_OK)) {
        Curl_failf(data,"Unable to resume from offset %ld",(data->state).resume_from);
        goto LAB_00131a90;
      }
    }
  }
  pcVar13 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
  if (pcVar13 == (char *)0x0) {
    cVar20 = Curl_creader_total_length(data);
    if (cVar20 < 0) {
      if (uVar26 < 0xb) {
        Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
      uVar22 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff | (uint)(uVar26 < 0x14) << 0xf;
    }
    else {
      uVar22 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
    }
    *(uint *)&(data->req).field_0xd9 = uVar22;
    local_90 = "Transfer-Encoding: chunked\r\n";
    if (-1 < (short)uVar22) {
      local_90 = "";
    }
  }
  else {
    _Var5 = Curl_compareheader(pcVar13,"Transfer-Encoding:",0x12,"chunked",7);
    uVar22 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
    *(uint *)&(data->req).field_0xd9 = (uint)_Var5 << 0xf | uVar22;
    local_90 = "";
    if (0x13 < uVar26 && _Var5) {
      if ((((data->set).field_0x897 & 0x40) != 0) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,
                   "suppressing chunked transfer encoding on connection using HTTP version 2 or higher"
                  );
        uVar22 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
      }
      *(uint *)&(data->req).field_0xd9 = uVar22;
    }
  }
  pcVar13 = Curl_checkheaders(data,"Accept",6);
  if (((data->state).field_0x7bf & 4) != 0) {
    switch(httpreq) {
    case HTTPREQ_GET:
    case HTTPREQ_HEAD:
      pcVar25 = Curl_checkheaders(data,"Range",5);
      if (pcVar25 == (char *)0x0) {
        (*Curl_cfree)((data->state).aptr.rangeline);
        pcVar25 = curl_maprintf("Range: bytes=%s\r\n",(data->state).range);
        (data->state).aptr.rangeline = pcVar25;
      }
      else if ((httpreq == HTTPREQ_PUT) || (httpreq == HTTPREQ_POST)) goto switchD_0013236e_caseD_1;
      break;
    case HTTPREQ_POST:
    case HTTPREQ_PUT:
switchD_0013236e_caseD_1:
      pcVar25 = Curl_checkheaders(data,"Content-Range",0xd);
      if (pcVar25 == (char *)0x0) {
        cVar20 = Curl_creader_total_length(data);
        (*Curl_cfree)((data->state).aptr.rangeline);
        if ((data->set).set_resume_from < 0) {
          pcVar25 = (char *)(cVar20 + -1);
          pcVar24 = "Content-Range: bytes 0-%ld/%ld\r\n";
LAB_00132559:
          pcVar25 = curl_maprintf(pcVar24,pcVar25,cVar20);
        }
        else {
          lVar23 = (data->state).resume_from;
          if (lVar23 == 0) {
            pcVar25 = (data->state).range;
            pcVar24 = "Content-Range: bytes %s/%ld\r\n";
            goto LAB_00132559;
          }
          if (((data->req).field_0xdb & 4) == 0) {
            lVar23 = lVar23 + cVar20;
          }
          else {
            lVar23 = (data->state).infilesize;
          }
          pcVar25 = curl_maprintf("Content-Range: bytes %s%ld/%ld\r\n",(data->state).range,
                                  lVar23 + -1);
        }
        (data->state).aptr.rangeline = pcVar25;
        if (pcVar25 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
    }
  }
  Curl_dyn_init(&req,0x100000);
  Curl_dyn_reset(&(data->state).headerb);
  CVar7 = Curl_dyn_addf(&req,"%s ",request);
  if (CVar7 == CURLE_OK) {
    pcVar25 = (data->set).str[0x3e];
    pcVar24 = pcVar25;
    if (pcVar25 == (char *)0x0) {
      pcVar24 = (data->state).up.path;
    }
    pcVar30 = (char *)0x0;
    if (pcVar25 == (char *)0x0) {
      pcVar30 = (data->state).up.query;
    }
    if (((ulong)conn->bits & 9) == 1) {
      u = curl_url_dup((data->state).uh);
      CVar7 = CURLE_OUT_OF_MEMORY;
      if (u != (CURLU *)0x0) {
        pcVar25 = (conn->host).name;
        if (((((conn->host).dispname == pcVar25) ||
             (CVar9 = curl_url_set(u,CURLUPART_HOST,pcVar25,0), CVar9 == CURLUE_OK)) &&
            (CVar9 = curl_url_set(u,CURLUPART_FRAGMENT,(char *)0x0,0), CVar9 == CURLUE_OK)) &&
           ((iVar8 = curl_strequal("http",(data->state).up.scheme), iVar8 == 0 ||
            ((CVar9 = curl_url_set(u,CURLUPART_USER,(char *)0x0,0), CVar9 == CURLUE_OK &&
             (CVar9 = curl_url_set(u,CURLUPART_PASSWORD,(char *)0x0,0), CVar9 == CURLUE_OK)))))) {
          CVar9 = curl_url_get(u,CURLUPART_URL,(char **)&local_68,2);
          curl_url_cleanup(u);
          if (CVar9 == CURLUE_OK) {
            pCVar16 = (Curl_llist_node *)(data->set).str[0x3e];
            if (pCVar16 == (Curl_llist_node *)0x0) {
              pCVar16 = local_68._head;
            }
            CVar7 = Curl_dyn_add(&req,(char *)pCVar16);
            (*Curl_cfree)(local_68._head);
            if (CVar7 == CURLE_OK) {
              iVar8 = curl_strequal("ftp",(data->state).up.scheme);
              if ((iVar8 != 0) && (((data->set).field_0x898 & 0x40) != 0)) {
                pcVar25 = strstr(pcVar24,";type=");
                if (pcVar25 == (char *)0x0) {
LAB_00132d33:
                  CVar7 = Curl_dyn_addf(&req,";type=%c",
                                        (ulong)((uint)((*(uint *)&(data->state).field_0x7be >> 0xe &
                                                       1) == 0) * 8 + 0x61));
                  if (CVar7 != CURLE_OK) goto LAB_001325da;
                }
                else if ((pcVar25[6] != '\0') && (pcVar25[7] == '\0')) {
                  bVar6 = Curl_raw_toupper(pcVar25[6]);
                  if ((8 < bVar6 - 0x41) || ((0x109U >> (bVar6 - 0x41 & 0x1f) & 1) == 0))
                  goto LAB_00132d33;
                }
              }
LAB_001326b0:
              if ((((ulong)conn->bits & 0x80) == 0) ||
                 (pcVar25 = Curl_checkheaders(data,"Alt-Used",8), pcVar25 != (char *)0x0)) {
                pcVar25 = (char *)0x0;
              }
              else {
                pcVar25 = curl_maprintf("Alt-Used: %s:%d\r\n",(conn->conn_to_host).name,
                                        (ulong)(uint)conn->conn_to_port);
                if (pcVar25 == (char *)0x0) {
                  Curl_dyn_free(&req);
                  return CURLE_OUT_OF_MEMORY;
                }
              }
              pcVar24 = (data->state).aptr.host;
              if (pcVar24 == (char *)0x0) {
                pcVar24 = "";
              }
              pcVar30 = (data->state).aptr.proxyuserpwd;
              if (pcVar30 == (char *)0x0) {
                pcVar30 = "";
              }
              pcVar31 = (data->state).aptr.userpwd;
              if (pcVar31 == (char *)0x0) {
                pcVar31 = "";
              }
              pcVar33 = "";
              if (((data->state).field_0x7bf & 4) != 0) {
                pcVar27 = (data->state).aptr.rangeline;
                pcVar33 = "";
                if (pcVar27 != (char *)0x0) {
                  pcVar33 = pcVar27;
                }
              }
              pcVar27 = (data->set).str[0x2b];
              pcVar29 = "";
              if ((pcVar27 != (char *)0x0) && (pcVar29 = "", *pcVar27 != '\0')) {
                pcVar27 = (data->state).aptr.uagent;
                pcVar29 = "";
                if (pcVar27 != (char *)0x0) {
                  pcVar29 = pcVar27;
                }
              }
              local_40 = "Accept: */*\r\n";
              if (pcVar13 != (char *)0x0) {
                local_40 = "";
              }
              pcVar13 = (data->state).aptr.te;
              if (pcVar13 == (char *)0x0) {
                pcVar13 = "";
              }
              pcVar27 = (data->set).str[0x21];
              local_48 = "";
              if ((pcVar27 != (char *)0x0) && (local_48 = "", *pcVar27 != '\0')) {
                pcVar27 = (data->state).aptr.accept_encoding;
                local_48 = "";
                if (pcVar27 != (char *)0x0) {
                  local_48 = pcVar27;
                }
              }
              pcVar27 = "";
              if ((data->state).referer != (char *)0x0) {
                pcVar32 = (data->state).aptr.ref;
                pcVar27 = "";
                if (pcVar32 != (char *)0x0) {
                  pcVar27 = pcVar32;
                }
              }
              pcVar32 = "";
              if (((ulong)conn->bits & 9) == 1) {
                local_80 = pcVar31;
                local_78 = pcVar30;
                local_70 = pcVar33;
                pcVar15 = Curl_checkheaders(data,"Proxy-Connection",0x10);
                pcVar32 = "";
                pcVar30 = local_78;
                pcVar31 = local_80;
                pcVar33 = local_70;
                if (pcVar15 == (char *)0x0) {
                  pcVar15 = Curl_checkProxyheaders(data,conn,"Proxy-Connection",0x10);
                  pcVar32 = "";
                  pcVar30 = local_78;
                  pcVar31 = local_80;
                  pcVar33 = local_70;
                  if (pcVar15 == (char *)0x0) {
                    pcVar32 = "Proxy-Connection: Keep-Alive\r\n";
                  }
                }
              }
              pcVar15 = "";
              if (pcVar25 != (char *)0x0) {
                pcVar15 = pcVar25;
              }
              CVar7 = Curl_dyn_addf(&req," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",pcVar12,pcVar24,
                                    pcVar30,pcVar31,pcVar33,pcVar29,local_40,pcVar13,local_48,
                                    pcVar27,pcVar32,local_90,pcVar15);
              (*Curl_cfree)((data->state).aptr.userpwd);
              (data->state).aptr.userpwd = (char *)0x0;
              (*Curl_cfree)((data->state).aptr.proxyuserpwd);
              (data->state).aptr.proxyuserpwd = (char *)0x0;
              (*Curl_cfree)(pcVar25);
              if (CVar7 != CURLE_OK) {
                Curl_dyn_free(&req);
                goto LAB_00131a90;
              }
              _Var5 = Curl_conn_is_ssl(conn,0);
              if ((((httpversion < 0x14) && (!_Var5)) && (((data->state).http_neg.wanted & 2) != 0))
                 && (((data->state).http_neg.field_0x3 & 1) != 0)) {
                Curl_dyn_free(&req);
                return CURLE_UNSUPPORTED_PROTOCOL;
              }
              if (((data->set).str[0x1a] == (char *)0x0) ||
                 (pcVar12 = Curl_checkheaders(data,"Cookie",6), pcVar12 != (char *)0x0)) {
                pcVar12 = (char *)0x0;
              }
              else {
                pcVar12 = (data->set).str[0x1a];
              }
              if (data->cookies == (CookieInfo *)0x0 && pcVar12 == (char *)0x0) {
LAB_00132e59:
                if ((((conn->handler->protocol < 0x40000000) ||
                     (CVar7 = Curl_ws_request(data,&req), CVar7 == CURLE_OK)) &&
                    ((CVar7 = Curl_add_timecondition(data,&req), CVar7 == CURLE_OK &&
                     (CVar7 = Curl_add_custom_headers(data,false,uVar26,&req), CVar7 == CURLE_OK))))
                   && ((((data->req).field_0xda & 0x80) == 0 ||
                       (CVar7 = Curl_httpchunk_add_reader(data), CVar7 == CURLE_OK)))) {
                  cVar20 = Curl_creader_total_length(data);
                  if (3 < httpreq - HTTPREQ_POST) goto LAB_0013301c;
                  if ((((cVar20 < 0) ||
                       (uVar22 = *(uint *)&(data->req).field_0xd9, (short)uVar22 < 0)) ||
                      (((uVar22 >> 0x12 & 1) == 0 &&
                       (pcVar12 = Curl_checkheaders(data,"Content-Length",0xe),
                       pcVar12 != (char *)0x0)))) ||
                     (CVar7 = Curl_dyn_addf(&req,"Content-Length: %ld\r\n",cVar20),
                     CVar7 == CURLE_OK)) {
                    pcVar14 = (data->state).mimepost;
                    if ((httpreq & (HTTPREQ_PUT|HTTPREQ_POST_FORM)) == HTTPREQ_POST_FORM &&
                        pcVar14 != (curl_mimepart *)0x0) {
                      ppcVar28 = &pcVar14->curlheaders;
                      do {
                        pcVar2 = *ppcVar28;
                        if (pcVar2 == (curl_slist *)0x0) goto LAB_00132fe8;
                        CVar7 = Curl_dyn_addf(&req,"%s\r\n",pcVar2->data);
                        ppcVar28 = &pcVar2->next;
                      } while (CVar7 == CURLE_OK);
                    }
                    else {
LAB_00132fe8:
                      if (((httpreq != HTTPREQ_POST) ||
                          (pcVar12 = Curl_checkheaders(data,"Content-Type",0xc),
                          pcVar12 != (char *)0x0)) ||
                         (CVar7 = Curl_dyn_addn(&req,
                                                "Content-Type: application/x-www-form-urlencoded\r\n"
                                                ,0x31), CVar7 == CURLE_OK)) {
                        if ((data->req).upgr101 == UPGR101_INIT) {
                          pcVar12 = Curl_checkheaders(data,"Expect",6);
                          if (pcVar12 == (char *)0x0) {
                            _Var5 = false;
                            if ((uVar26 == 0xb) &&
                               ((*(uint *)&(data->state).field_0x7be & 0x200) == 0)) {
                              uVar21 = Curl_creader_client_length(data);
                              if (uVar21 < 0x100001) goto LAB_0013301c;
                              CVar7 = Curl_dyn_addn(&req,"Expect: 100-continue\r\n",0x16);
                              if (CVar7 != CURLE_OK) goto LAB_001331b6;
                              _Var5 = true;
                            }
                          }
                          else {
                            _Var5 = Curl_compareheader(pcVar12,"Expect:",7,"100-continue",0xc);
                          }
                        }
                        else {
LAB_0013301c:
                          _Var5 = false;
                        }
                        CVar7 = Curl_dyn_addn(&req,"\r\n",2);
                        if (CVar7 == CURLE_OK) {
                          Curl_pgrsSetUploadSize(data,cVar20);
                          if (_Var5 != false) {
                            local_68._head = (Curl_llist_node *)0x0;
                            CVar7 = Curl_creader_create((Curl_creader **)&local_68,data,&cr_exp100,
                                                        CURL_CR_PROTOCOL);
                            if ((CVar7 != CURLE_OK) ||
                               (CVar7 = Curl_creader_add(data,(Curl_creader *)local_68._head),
                               CVar7 != CURLE_OK)) {
                              if (local_68._head != (Curl_llist_node *)0x0) {
                                Curl_creader_free(data,(Curl_creader *)local_68._head);
                              }
                              goto LAB_001331b6;
                            }
                            *(undefined4 *)&(local_68._head)->_prev[1]._prev = 2;
                          }
                          Curl_xfer_setup1(data,3,-1,true);
                          CVar7 = Curl_req_send(data,&req,httpversion);
                        }
                      }
                    }
                  }
                }
              }
              else {
                iVar8 = 0;
                if (data->cookies == (CookieInfo *)0x0) {
                  bVar34 = false;
                  CVar7 = CURLE_OK;
                }
                else {
                  bVar34 = false;
                  CVar7 = CURLE_OK;
                  iVar8 = 0;
                  if (((data->state).field_0x7bf & 0x20) != 0) {
                    pcVar13 = (data->state).aptr.cookiehost;
                    if (pcVar13 == (char *)0x0) {
                      pcVar13 = (conn->host).name;
                    }
                    _Var5 = true;
                    if ((((conn->handler->protocol & 0x80000002) == 0) &&
                        (iVar8 = curl_strequal("localhost",pcVar13), iVar8 == 0)) &&
                       (iVar8 = strcmp(pcVar13,"127.0.0.1"), iVar8 != 0)) {
                      iVar8 = strcmp(pcVar13,"::1");
                      _Var5 = iVar8 == 0;
                    }
                    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                    iVar10 = Curl_cookie_getlist(data,data->cookies,pcVar13,(data->state).up.path,
                                                 _Var5,&local_68);
                    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
                    iVar8 = 0;
                    bVar34 = false;
                    CVar7 = CURLE_OK;
                    if (iVar10 == 0) {
                      pCVar16 = Curl_llist_head(&local_68);
                      CVar7 = CURLE_OK;
                      iVar8 = 0;
                      local_98 = 8;
                      for (; pCVar16 != (Curl_llist_node *)0x0; pCVar16 = Curl_node_next(pCVar16)) {
                        pvVar17 = Curl_node_elem(pCVar16);
                        pcVar13 = *(char **)((long)pvVar17 + 0x48);
                        if (pcVar13 != (char *)0x0) {
                          if (iVar8 == 0) {
                            CVar11 = Curl_dyn_addn(&req,"Cookie: ",8);
                            if (CVar11 == CURLE_OK) {
                              pcVar13 = *(char **)((long)pvVar17 + 0x48);
                              goto LAB_00132bf6;
                            }
                            iVar8 = 0;
                          }
                          else {
LAB_00132bf6:
                            pcVar25 = *(char **)((long)pvVar17 + 0x40);
                            sVar18 = strlen(pcVar25);
                            sVar19 = strlen(pcVar13);
                            if (0x1ffd < sVar19 + sVar18 + local_98 + 1) {
                              bVar3 = true;
                              bVar34 = true;
                              if (((data != (Curl_easy *)0x0) &&
                                  (bVar34 = bVar3, ((data->set).field_0x897 & 0x40) != 0)) &&
                                 ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                                  (0 < pcVar1->log_level)))) {
                                CVar7 = CURLE_OK;
                                Curl_infof(data,
                                           "Restricted outgoing cookies due to header size, \'%s\' not sent"
                                           ,pcVar25);
                              }
                              goto LAB_00132dd4;
                            }
                            pcVar24 = "; ";
                            if (iVar8 == 0) {
                              pcVar24 = "";
                            }
                            CVar11 = Curl_dyn_addf(&req,"%s%s=%s",pcVar24,pcVar25,pcVar13);
                            if (CVar11 == CURLE_OK) {
                              local_98 = local_98 + (ulong)(iVar8 != 0) * 2 + sVar18 + sVar19 + 1;
                              iVar8 = iVar8 + 1;
                              goto LAB_00132c8b;
                            }
                          }
                          CVar7 = CVar11;
                          bVar34 = false;
                          goto LAB_00132dd4;
                        }
LAB_00132c8b:
                      }
                      bVar34 = false;
LAB_00132dd4:
                      Curl_llist_destroy(&local_68,(void *)0x0);
                    }
                  }
                }
                if (((pcVar12 == (char *)0x0) || (bVar34)) || (CVar7 != CURLE_OK)) {
LAB_00132e29:
                  if ((iVar8 != 0) && (CVar7 == CURLE_OK)) {
                    CVar7 = Curl_dyn_addn(&req,"\r\n",2);
                  }
                  if (CVar7 == CURLE_OK) goto LAB_00132e59;
                }
                else {
                  if (iVar8 != 0) {
                    pcVar13 = "; ";
LAB_00132e09:
                    CVar7 = Curl_dyn_addf(&req,"%s%s",pcVar13,pcVar12);
                    iVar8 = iVar8 + 1;
                    goto LAB_00132e29;
                  }
                  CVar7 = Curl_dyn_addn(&req,"Cookie: ",8);
                  if (CVar7 == CURLE_OK) {
                    pcVar13 = "";
                    goto LAB_00132e09;
                  }
                }
              }
LAB_001331b6:
              Curl_dyn_free(&req);
              if ((0x13 < httpversion) && (CVar7 == CURLE_OK)) {
                uVar26 = *(uint *)&(data->req).field_0xd9;
                if ((short)uVar26 < 0) {
                  *(uint *)&(data->req).field_0xd9 = uVar26 & 0xffff7fff;
                }
                return CURLE_OK;
              }
              goto LAB_00131a90;
            }
          }
        }
        else {
          curl_url_cleanup(u);
        }
      }
    }
    else {
      CVar7 = Curl_dyn_add(&req,pcVar24);
      if ((CVar7 == CURLE_OK) &&
         ((pcVar30 == (char *)0x0 || (CVar7 = Curl_dyn_addf(&req,"?%s",pcVar30), CVar7 == CURLE_OK))
         )) goto LAB_001326b0;
    }
  }
LAB_001325da:
  Curl_dyn_free(&req);
LAB_00131a90:
  if (CVar7 == CURLE_TOO_LARGE) {
    Curl_failf(data,"HTTP request too large");
    CVar7 = CURLE_TOO_LARGE;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */
  unsigned char httpversion;

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  switch(conn->alpn) {
  case CURL_HTTP_VERSION_3:
    DEBUGASSERT(Curl_conn_http_version(data, conn) == 30);
    break;
  case CURL_HTTP_VERSION_2:
#ifndef CURL_DISABLE_PROXY
    if((Curl_conn_http_version(data, conn) != 20) &&
       conn->bits.proxy && !conn->bits.tunnel_proxy
      ) {
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    else
#endif
      DEBUGASSERT(Curl_conn_http_version(data, conn) == 20);
    break;
  case CURL_HTTP_VERSION_1_1:
    /* continue with HTTP/1.x when explicitly requested */
    break;
  default:
    /* Check if user wants to use HTTP/2 with clear TCP */
    if(Curl_http2_may_switch(data)) {
      DEBUGF(infof(data, "HTTP/2 over clean TCP"));
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    break;
  }

  /* Add collecting of headers written to client. For a new connection,
   * we might have done that already, but reuse
   * or multiplex needs it here as well. */
  result = Curl_headers_init(data);
  if(result)
    goto fail;

  result = http_host(data, conn);
  if(result)
    goto fail;

  result = http_useragent(data);
  if(result)
    goto fail;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      goto fail;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    free(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = http_transferencode(data);
  if(result)
    goto fail;
#endif

  httpversion = http_request_version(data);
  httpstring = get_http_string(httpversion);

  result = http_req_set_reader(data, httpreq, httpversion, &te);
  if(result)
    goto fail;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept")) ? NULL : "Accept: */*\r\n";

  result = http_range(data, httpreq);
  if(result)
    goto fail;

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host ? data->state.aptr.host : ""),
#ifndef CURL_DISABLE_PROXY
                  data->state.aptr.proxyuserpwd ?
                  data->state.aptr.proxyuserpwd : "",
#else
                  "",
#endif
                  data->state.aptr.userpwd ? data->state.aptr.userpwd : "",
                  (data->state.use_range && data->state.aptr.rangeline) ?
                  data->state.aptr.rangeline : "",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent) ?
                  data->state.aptr.uagent : "",
                  p_accept ? p_accept : "",
                  data->state.aptr.te ? data->state.aptr.te : "",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding) ?
                  data->state.aptr.accept_encoding : "",
                  (data->state.referer && data->state.aptr.ref) ?
                  data->state.aptr.ref : "" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data, conn,
                                           STRCONST("Proxy-Connection"))) ?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid reusing old credentials
   * from reused connections */
  Curl_safefree(data->state.aptr.userpwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET) && (httpversion < 20) &&
     (data->state.http_neg.wanted & CURL_HTTP_V2x) &&
     data->state.http_neg.h2_upgrade) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it is not done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = http_cookies(data, conn, &req);
#ifndef CURL_DISABLE_WEBSOCKETS
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
#endif
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, httpversion, &req);

  if(!result) {
    /* req_send takes ownership of the 'req' memory on success */
    result = http_req_complete(data, &req, httpversion, httpreq);
    if(!result)
      result = Curl_req_send(data, &req, httpversion);
  }
  Curl_dyn_free(&req);
  if(result)
    goto fail;

  if((httpversion >= 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
fail:
  if(CURLE_TOO_LARGE == result)
    failf(data, "HTTP request too large");
  return result;
}